

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

uint __thiscall crnlib::symbol_codec::decode_truncated_binary(symbol_codec *this,uint n)

{
  uint uVar1;
  uint uVar2;
  undefined4 local_20;
  uint i;
  uint u;
  uint k;
  uint n_local;
  symbol_codec *this_local;
  
  uVar1 = math::floor_log2i(n);
  uVar2 = (1 << ((char)uVar1 + 1U & 0x1f)) - n;
  local_20 = decode_bits(this,uVar1);
  if (uVar2 <= local_20) {
    uVar1 = decode_bits(this,1);
    local_20 = (local_20 << 1 | uVar1) - uVar2;
  }
  return local_20;
}

Assistant:

uint symbol_codec::decode_truncated_binary(uint n) {
  CRNLIB_ASSERT(n >= 2);

  uint k = math::floor_log2i(n);
  uint u = (1 << (k + 1)) - n;

  uint i = decode_bits(k);

  if (i >= u)
    i = ((i << 1) | decode_bits(1)) - u;

  return i;
}